

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O0

void __thiscall cnn::ShadowParameters::ShadowParameters(ShadowParameters *this,Parameters *p)

{
  float *pfVar1;
  Tensor *in_RDI;
  size_t in_stack_00000018;
  size_t in_stack_00000020;
  Tensor *in_stack_ffffffffffffffc8;
  
  Tensor::Tensor(in_RDI,in_stack_ffffffffffffffc8);
  Dim::size(&in_RDI->d);
  pfVar1 = (float *)cnn_mm_malloc(in_stack_00000020,in_stack_00000018);
  in_RDI->v = pfVar1;
  TensorTools::Zero((Tensor *)0x52b98c);
  return;
}

Assistant:

ShadowParameters::ShadowParameters(const Parameters& p) : h(p.values) {
  h.v = (float*)cnn_mm_malloc(h.d.size() * sizeof(float), 256);
  TensorTools::Zero(h);
}